

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O0

parameters * parameters_get(int K)

{
  long lVar1;
  int in_ESI;
  parameters *in_RDI;
  base_param_set *P;
  int i;
  parameters R;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  int local_8;
  int local_4;
  
  if (in_ESI < 1) {
    memset(in_RDI,0,0x2c);
    in_RDI->K = -1;
  }
  else {
    local_4 = in_ESI;
    memset(&local_30,0,0x2c);
    local_30 = local_4;
    for (local_34 = 0; local_34 < 0x1dd; local_34 = local_34 + 1) {
      if (local_4 <= base_param_sets[local_34].Kprime) {
        lVar1 = (long)local_34;
        local_2c = base_param_sets[lVar1].Kprime;
        local_28 = base_param_sets[lVar1].J;
        local_20 = base_param_sets[lVar1].S;
        local_1c = base_param_sets[lVar1].H;
        local_14 = base_param_sets[lVar1].W;
        break;
      }
    }
    if (local_34 == 0x1dd) {
      memset(in_RDI,0,0x2c);
      in_RDI->K = -1;
    }
    else {
      local_24 = local_2c + local_20 + local_1c;
      local_10 = local_24 - local_14;
      local_c = nextprime(local_10);
      local_8 = local_10 - local_1c;
      local_18 = local_14 - local_20;
      memcpy(in_RDI,&local_30,0x2c);
    }
  }
  return in_RDI;
}

Assistant:

parameters parameters_get(int K)
{
	/* Input validation */
	if (K <= 0) {
		return (parameters){ -1 };
	}

	/* Determine Kprime, J, S, H and W from param_sets */
	parameters R = { .K = K };
	int i;
	for (i = 0; i < base_param_sets_sz; ++i) {
		if (K <= base_param_sets[i].Kprime) {
			const base_param_set* P = &base_param_sets[i];
			R.Kprime = P->Kprime;
			R.J = P->J;
			R.S = P->S;
			R.H = P->H;
			R.W = P->W;
			break;
		}
	}
	if (i == base_param_sets_sz) {
		return (parameters){ -1 };
	}

	/* Assign the remaining variables */
	R.L = R.Kprime + R.S + R.H;
	R.P = R.L - R.W;
	R.P1 = nextprime(R.P);
	R.U = R.P - R.H;
	R.B = R.W - R.S;

	return R;
}